

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol_p.h
# Opt level: O1

bool __thiscall QWidgetLineControl::composeMode(QWidgetLineControl *this)

{
  long lVar1;
  long in_FS_OFFSET;
  QArrayData *local_28;
  long local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QTextLayout::preeditAreaText();
  if (local_28 != (QArrayData *)0x0) {
    LOCK();
    (local_28->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_28->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_28->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_28,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_18 != 0;
  }
  __stack_chk_fail();
}

Assistant:

bool composeMode() const { return !m_textLayout.preeditAreaText().isEmpty(); }